

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

SurfaceInteraction * __thiscall
phyr::Transform::operator()
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  Shape *pSVar28;
  Normal3f *pNVar29;
  Normal3f *pNVar30;
  uint uVar31;
  anon_struct_128_6_d0712383_for_shadingGeom *paVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dStack_100;
  
  dVar44 = (si->super_Interaction).p.x;
  dVar1 = (si->super_Interaction).p.y;
  dVar2 = (si->super_Interaction).p.z;
  dVar3 = (this->mat).d[2][0];
  dVar4 = (this->mat).d[2][1];
  dVar5 = (this->mat).d[2][2];
  dVar49 = (si->super_Interaction).pfError.x;
  dVar42 = (si->super_Interaction).pfError.y;
  dVar6 = (si->super_Interaction).pfError.z;
  dVar37 = (this->mat).d[2][3];
  dVar45 = dVar3 * dVar44 + dVar1 * dVar4 + dVar5 * dVar2 + dVar37;
  dVar7 = (this->mat).d[1][1];
  dVar8 = (this->mat).d[0][1];
  dVar9 = (this->mat).d[0][0];
  dVar10 = (this->mat).d[1][0];
  dVar11 = (this->mat).d[0][2];
  dVar12 = (this->mat).d[1][2];
  auVar14._8_4_ = SUB84(dVar12,0);
  auVar14._0_8_ = dVar11;
  auVar14._12_4_ = (int)((ulong)dVar12 >> 0x20);
  dVar38 = (this->mat).d[0][3];
  dVar39 = (this->mat).d[1][3];
  dVar48 = (this->mat).d[3][2] * dVar2 + (this->mat).d[3][0] * dVar44 + (this->mat).d[3][1] * dVar1
           + (this->mat).d[3][3];
  (__return_storage_ptr__->super_Interaction).pfError.x =
       (dVar6 * ABS(dVar11) + dVar49 * ABS(dVar9) + dVar42 * ABS(dVar8)) * 1.0000000000000004 +
       (ABS(dVar38) + ABS(dVar2 * dVar11) + ABS(dVar1 * dVar8) + ABS(dVar44 * dVar9)) *
       3.3306690738754706e-16;
  (__return_storage_ptr__->super_Interaction).pfError.y =
       (dVar6 * ABS(dVar12) + dVar49 * ABS(dVar10) + dVar42 * ABS(dVar7)) * 1.0000000000000004 +
       (ABS(dVar39) + ABS(dVar2 * dVar12) + ABS(dVar1 * dVar7) + ABS(dVar44 * dVar10)) *
       3.3306690738754706e-16;
  (__return_storage_ptr__->super_Interaction).pfError.z =
       (ABS(dVar5) * dVar6 + ABS(dVar3) * dVar49 + ABS(dVar4) * dVar42) * 1.0000000000000004 +
       (ABS(dVar37) + ABS(dVar5 * dVar2) + ABS(dVar1 * dVar4) + ABS(dVar3 * dVar44)) *
       3.3306690738754706e-16;
  uVar31 = -(uint)(dVar48 == 1.0) & 1;
  dVar42 = 1.0 / dVar48;
  dVar49 = dVar45 * dVar42;
  if ((dVar48 == 1.0) && (!NAN(dVar48))) {
    dVar49 = dVar45;
  }
  dVar38 = dVar2 * dVar11 + dVar44 * dVar9 + dVar1 * dVar8 + dVar38;
  dVar39 = dVar2 * dVar12 + dVar44 * dVar10 + dVar1 * dVar7 + dVar39;
  auVar34._0_8_ = CONCAT44((int)(uVar31 << 0x1f) >> 0x1f,(int)(uVar31 << 0x1f) >> 0x1f);
  auVar34._8_4_ = (int)(uVar31 << 0x1f) >> 0x1f;
  auVar34._12_4_ = (int)(uVar31 << 0x1f) >> 0x1f;
  (__return_storage_ptr__->super_Interaction).p.x =
       (double)(~auVar34._0_8_ & (ulong)(dVar42 * dVar38) | (ulong)dVar38 & auVar34._0_8_);
  (__return_storage_ptr__->super_Interaction).p.y =
       (double)(~auVar34._8_8_ & (ulong)(dVar42 * dVar39) | (ulong)dVar39 & auVar34._8_8_);
  (__return_storage_ptr__->super_Interaction).p.z = dVar49;
  dVar37 = (si->super_Interaction).n.x;
  dVar39 = (si->super_Interaction).n.y;
  dVar38 = (this->invMat).d[1][0];
  dVar45 = (this->invMat).d[1][1];
  dVar48 = (this->invMat).d[0][0];
  dVar18 = (this->invMat).d[0][1];
  dVar19 = (si->super_Interaction).n.z;
  dVar20 = (this->invMat).d[2][0];
  dVar21 = (this->invMat).d[2][1];
  dVar46 = dVar19 * dVar20 + dVar37 * dVar48 + dVar39 * dVar38;
  dVar47 = dVar19 * dVar21 + dVar37 * dVar18 + dVar39 * dVar45;
  dVar44 = (this->invMat).d[1][2];
  dVar1 = (si->super_Interaction).wo.y;
  dVar2 = (this->invMat).d[0][2];
  dVar49 = (si->super_Interaction).wo.x;
  dVar42 = (this->invMat).d[2][2];
  dVar6 = (si->super_Interaction).wo.z;
  dVar40 = dVar19 * dVar42 + dVar37 * dVar2 + dVar39 * dVar44;
  dVar39 = dVar6 * dVar11 + dVar49 * dVar9 + dVar1 * dVar8;
  dVar37 = dVar6 * dVar12 + dVar49 * dVar10 + dVar1 * dVar7;
  dVar1 = dVar6 * dVar5 + dVar49 * dVar3 + dVar1 * dVar4;
  auVar35._0_8_ = dVar46 * dVar46 + dVar47 * dVar47;
  auVar35._8_8_ = dVar39 * dVar39 + dVar37 * dVar37;
  auVar17._8_8_ = dVar1 * dVar1 + auVar35._8_8_;
  auVar17._0_8_ = dVar40 * dVar40 + auVar35._0_8_;
  auVar36 = sqrtpd(auVar35,auVar17);
  auVar36 = divpd(_DAT_0010c060,auVar36);
  dVar50 = auVar36._0_8_;
  dVar49 = auVar36._8_8_;
  dVar22 = (this->invMat).d[0][1];
  dVar23 = (this->invMat).d[0][2];
  dVar24 = (this->invMat).d[1][1];
  dVar25 = (this->invMat).d[1][2];
  dVar26 = (this->invMat).d[2][1];
  dVar27 = (this->invMat).d[2][2];
  (__return_storage_ptr__->super_Interaction).wo.y = dVar49 * dVar37;
  (__return_storage_ptr__->super_Interaction).wo.z = dVar49 * dVar1;
  dVar40 = dVar40 * dVar50;
  dVar46 = dVar50 * dVar46;
  dVar50 = dVar50 * dVar47;
  (__return_storage_ptr__->super_Interaction).n.x = dVar46;
  (__return_storage_ptr__->super_Interaction).n.y = dVar50;
  (__return_storage_ptr__->super_Interaction).n.z = dVar40;
  (__return_storage_ptr__->super_Interaction).wo.x = dVar39 * dVar49;
  dVar1 = (si->uv).y;
  (__return_storage_ptr__->uv).x = (si->uv).x;
  (__return_storage_ptr__->uv).y = dVar1;
  dVar37 = (si->dpdu).y;
  dVar39 = (si->dpdu).x;
  dVar19 = (si->dpdu).z;
  dStack_100 = auVar14._8_8_;
  (__return_storage_ptr__->dpdu).x = dVar19 * dVar11 + dVar39 * dVar9 + dVar37 * dVar8;
  (__return_storage_ptr__->dpdu).y = dVar19 * dStack_100 + dVar39 * dVar10 + dVar37 * dVar7;
  dVar1 = (si->dpdv).y;
  dVar49 = (si->dpdv).x;
  dVar6 = (si->dpdv).z;
  (__return_storage_ptr__->dpdu).z = dVar19 * dVar5 + dVar39 * dVar3 + dVar37 * dVar4;
  (__return_storage_ptr__->dpdv).x = dVar6 * dVar11 + dVar49 * dVar9 + dVar1 * dVar8;
  (__return_storage_ptr__->dpdv).y = dVar6 * dVar12 + dVar49 * dVar10 + dVar1 * dVar7;
  (__return_storage_ptr__->dpdv).z = dVar6 * dVar5 + dVar49 * dVar3 + dVar1 * dVar4;
  dVar37 = (si->dndu).y;
  dVar39 = (si->dndu).x;
  dVar19 = (si->dndu).z;
  (__return_storage_ptr__->dndu).x = dVar19 * dVar20 + dVar39 * dVar48 + dVar37 * dVar38;
  (__return_storage_ptr__->dndu).y = dVar19 * dVar21 + dVar39 * dVar18 + dVar37 * dVar45;
  dVar1 = (si->dndv).y;
  dVar49 = (si->dndv).x;
  dVar6 = (si->dndv).z;
  (__return_storage_ptr__->dndu).z = dVar19 * dVar42 + dVar39 * dVar2 + dVar37 * dVar44;
  (__return_storage_ptr__->dndv).x = dVar6 * dVar20 + dVar49 * dVar48 + dVar1 * dVar38;
  (__return_storage_ptr__->dndv).y = dVar6 * dVar26 + dVar49 * dVar22 + dVar1 * dVar24;
  (__return_storage_ptr__->dndv).z = dVar6 * dVar27 + dVar49 * dVar23 + dVar1 * dVar25;
  dVar1 = (si->shadingGeom).n.y;
  dVar49 = (si->shadingGeom).n.x;
  dVar6 = (si->shadingGeom).n.z;
  dVar33 = dVar6 * dVar20 + dVar49 * dVar48 + dVar1 * dVar38;
  dVar37 = dVar6 * dVar21 + dVar49 * dVar18 + dVar1 * dVar45;
  dVar43 = dVar2 * dVar49 + dVar44 * dVar1 + dVar42 * dVar6;
  dVar41 = 1.0 / SQRT(dVar43 * dVar43 + dVar33 * dVar33 + dVar37 * dVar37);
  dVar43 = dVar43 * dVar41;
  dVar33 = dVar41 * dVar33;
  dVar41 = dVar41 * dVar37;
  (__return_storage_ptr__->shadingGeom).n.x = dVar33;
  (__return_storage_ptr__->shadingGeom).n.y = dVar41;
  (__return_storage_ptr__->shadingGeom).n.z = dVar43;
  dVar39 = (si->shadingGeom).dpdu.y;
  dVar19 = (si->shadingGeom).dpdu.x;
  dVar47 = (si->shadingGeom).dpdu.z;
  (__return_storage_ptr__->shadingGeom).dpdu.x = dVar47 * dVar11 + dVar19 * dVar9 + dVar39 * dVar8;
  (__return_storage_ptr__->shadingGeom).dpdu.y =
       dVar47 * dStack_100 + dVar19 * dVar10 + dVar39 * dVar7;
  dVar1 = (si->shadingGeom).dpdv.y;
  dVar49 = (si->shadingGeom).dpdv.x;
  dVar6 = (si->shadingGeom).dpdv.z;
  dVar37 = dVar6 * dVar11 + dVar49 * dVar9 + dVar1 * dVar8;
  auVar36._8_4_ = SUB84(dVar37,0);
  auVar36._0_8_ = dVar47 * dVar5 + dVar19 * dVar3 + dVar39 * dVar4;
  auVar36._12_4_ = (int)((ulong)dVar37 >> 0x20);
  *(undefined1 (*) [16])&(__return_storage_ptr__->shadingGeom).dpdu.z = auVar36;
  (__return_storage_ptr__->shadingGeom).dpdv.y = dVar6 * dVar12 + dVar49 * dVar10 + dVar1 * dVar7;
  (__return_storage_ptr__->shadingGeom).dpdv.z = dVar6 * dVar5 + dVar49 * dVar3 + dVar1 * dVar4;
  dVar39 = (si->shadingGeom).dndu.y;
  dVar19 = (si->shadingGeom).dndu.x;
  dVar47 = (si->shadingGeom).dndu.z;
  (__return_storage_ptr__->shadingGeom).dndu.x = dVar47 * dVar20 + dVar19 * dVar48 + dVar39 * dVar38
  ;
  (__return_storage_ptr__->shadingGeom).dndu.y = dVar47 * dVar21 + dVar19 * dVar18 + dVar39 * dVar45
  ;
  dVar1 = (si->shadingGeom).dndv.y;
  dVar49 = (si->shadingGeom).dndv.x;
  dVar6 = (si->shadingGeom).dndv.z;
  dVar37 = dVar6 * dVar20 + dVar49 * dVar48 + dVar1 * dVar38;
  auVar15._8_4_ = SUB84(dVar37,0);
  auVar15._0_8_ = dVar47 * dVar42 + dVar19 * dVar2 + dVar39 * dVar44;
  auVar15._12_4_ = (int)((ulong)dVar37 >> 0x20);
  *(undefined1 (*) [16])&(__return_storage_ptr__->shadingGeom).dndu.z = auVar15;
  (__return_storage_ptr__->shadingGeom).dndv.y = dVar6 * dVar26 + dVar49 * dVar22 + dVar1 * dVar24;
  (__return_storage_ptr__->shadingGeom).dndv.z = dVar6 * dVar27 + dVar49 * dVar23 + dVar1 * dVar25;
  pSVar28 = si->shape;
  __return_storage_ptr__->bsdf = si->bsdf;
  __return_storage_ptr__->shape = pSVar28;
  __return_storage_ptr__->object = si->object;
  dVar44 = si->dvdx;
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = dVar44;
  dVar44 = si->dvdy;
  __return_storage_ptr__->dudy = si->dudy;
  __return_storage_ptr__->dvdy = dVar44;
  dVar49 = (si->dpdx).x;
  dVar42 = (si->dpdx).y;
  dVar6 = (si->dpdx).z;
  dVar44 = dVar6 * dVar11 + dVar49 * dVar9 + dVar42 * dVar8;
  dVar1 = dVar6 * dStack_100 + dVar49 * dVar10 + dVar42 * dVar7;
  auVar16._8_4_ = SUB84(dVar1,0);
  auVar16._0_8_ = dVar44;
  auVar16._12_4_ = (int)((ulong)dVar1 >> 0x20);
  (__return_storage_ptr__->dpdx).x = dVar44;
  (__return_storage_ptr__->dpdx).y = (double)auVar16._8_8_;
  dVar44 = (si->dpdy).y;
  dVar1 = (si->dpdy).x;
  dVar2 = (si->dpdy).z;
  (__return_storage_ptr__->dpdx).z = dVar6 * dVar5 + dVar49 * dVar3 + dVar42 * dVar4;
  (__return_storage_ptr__->dpdy).x = dVar2 * dVar11 + dVar1 * dVar9 + dVar44 * dVar8;
  (__return_storage_ptr__->dpdy).y = dVar2 * dVar12 + dVar1 * dVar10 + dVar44 * dVar7;
  (__return_storage_ptr__->dpdy).z = dVar2 * dVar5 + dVar1 * dVar3 + dVar44 * dVar4;
  bVar13 = (si->shadingGeom).overridesOrientation;
  (__return_storage_ptr__->shadingGeom).overridesOrientation = bVar13;
  if (bVar13 == true) {
    paVar32 = (anon_struct_128_6_d0712383_for_shadingGeom *)
              &(__return_storage_ptr__->super_Interaction).n;
    pNVar29 = &(__return_storage_ptr__->super_Interaction).n;
    pNVar30 = &(__return_storage_ptr__->super_Interaction).n;
    dVar44 = dVar43 * dVar40 + dVar33 * dVar46 + dVar50 * dVar41;
    dVar43 = dVar40;
    dVar33 = dVar46;
    dVar41 = dVar50;
  }
  else {
    paVar32 = &__return_storage_ptr__->shadingGeom;
    pNVar29 = &(__return_storage_ptr__->shadingGeom).n;
    pNVar30 = &(__return_storage_ptr__->shadingGeom).n;
    dVar44 = dVar40 * dVar43 + dVar46 * dVar33 + dVar50 * dVar41;
  }
  if (dVar44 < 0.0) {
    dVar33 = -dVar33;
    dVar41 = -dVar41;
  }
  (paVar32->n).x = dVar33;
  pNVar30->y = dVar41;
  pNVar29->z = (double)(~-(ulong)(dVar44 < 0.0) & (ulong)dVar43 |
                       (ulong)-dVar43 & -(ulong)(dVar44 < 0.0));
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::operator()(const SurfaceInteraction& si) const {
    SurfaceInteraction nsi;
    const Transform& tr = *this;

    // Interaction members
    nsi.p = tr(si.p, si.pfError, &nsi.pfError);
    nsi.n = normalize(tr(si.n)); nsi.wo = normalize(tr(si.wo));

    // SurfaceInteraction members
    nsi.uv = si.uv; nsi.shape = si.shape;
    nsi.dpdu = tr(si.dpdu); nsi.dpdv = tr(si.dpdv);
    nsi.dndu = tr(si.dndu); nsi.dndv = tr(si.dndv);
    // SurfaceInteraction::shadingGeometry members
    nsi.shadingGeom.n = normalize(tr(si.shadingGeom.n));
    nsi.shadingGeom.dpdu = tr(si.shadingGeom.dpdu);
    nsi.shadingGeom.dpdv = tr(si.shadingGeom.dpdv);
    nsi.shadingGeom.dndu = tr(si.shadingGeom.dndu);
    nsi.shadingGeom.dndv = tr(si.shadingGeom.dndv);

    nsi.bsdf = si.bsdf; nsi.object = si.object;
    nsi.dudx = si.dudx; nsi.dvdx = si.dvdx;
    nsi.dudy = si.dudy; nsi.dvdy = si.dvdy;
    nsi.dpdx = tr(si.dpdx); nsi.dpdy = tr(si.dpdy);

    // Check if normals should be readjusted
    nsi.shadingGeom.overridesOrientation = si.shadingGeom.overridesOrientation;
    if (nsi.shadingGeom.overridesOrientation)
        nsi.n = faceForward(nsi.n, nsi.shadingGeom.n);
    else
        nsi.shadingGeom.n = faceForward(nsi.shadingGeom.n, nsi.n);

    return nsi;
}